

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O3

void __thiscall SCCLiveness::EndOpHelper(SCCLiveness *this,Instr *instr)

{
  RealCount *pRVar1;
  JitArenaAllocator *pJVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  Type pSVar7;
  
  if (this->lastOpHelperLabel == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                       ,0x164,"(this->lastOpHelperLabel != nullptr)",
                       "this->lastOpHelperLabel != nullptr");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  pJVar2 = this->tempAlloc;
  pSVar7 = (Type)new<Memory::ArenaAllocator>(0x30,(this->opHelperBlockList).allocator,0x364470);
  pSVar7[3].next = pSVar7 + 3;
  *(undefined4 *)&pSVar7[4].next = 0;
  pSVar7[5].next = (Type)pJVar2;
  pSVar7->next = (this->opHelperBlockList).
                 super_SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>.
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
  (this->opHelperBlockList).super_SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar7;
  pRVar1 = &(this->opHelperBlockList).
            super_SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>.super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  pSVar7[1].next = (Type)this->lastOpHelperLabel;
  pSVar7[2].next = (Type)instr;
  uVar5 = OpHelperBlock::Length((OpHelperBlock *)(pSVar7 + 1));
  this->totalOpHelperFullVisitedLength = this->totalOpHelperFullVisitedLength + uVar5;
  this->lastOpHelperLabel = (LabelInstr *)0x0;
  return;
}

Assistant:

void
SCCLiveness::EndOpHelper(IR::Instr * instr)
{
    Assert(this->lastOpHelperLabel != nullptr);

    OpHelperBlock * opHelperBlock = this->opHelperBlockList.PrependNode(this->tempAlloc);
    Assert(opHelperBlock != nullptr);
    opHelperBlock->opHelperLabel = this->lastOpHelperLabel;
    opHelperBlock->opHelperEndInstr = instr;

    this->totalOpHelperFullVisitedLength += opHelperBlock->Length();
    this->lastOpHelperLabel = nullptr;
}